

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_sgset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  long lVar4;
  long in_RDI;
  __type_conflict2 _Var5;
  char mesg [4608];
  int i;
  int gn;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffc9c8;
  CHAR_DATA *in_stack_ffffffffffffc9d0;
  CHAR_DATA *in_stack_ffffffffffffc9d8;
  char *in_stack_ffffffffffffc9e0;
  int local_2428;
  char local_2418 [4584];
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char local_1218;
  
  one_argument((char *)in_stack_ffffffffffffc9d0,(char *)in_stack_ffffffffffffc9c8);
  one_argument((char *)in_stack_ffffffffffffc9d0,(char *)in_stack_ffffffffffffc9c8);
  if ((local_1218 == '\0') || (local_2418[0] == '\0')) {
    send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
  }
  else {
    pCVar3 = get_char_world(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    if (pCVar3 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
    }
    else {
      bVar1 = is_npc(in_stack_ffffffffffffc9c8);
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
      }
      else {
        iVar2 = group_lookup((char *)in_stack_ffffffffffffc9d8);
        if (iVar2 != -1) {
          if ((*(byte *)(*(long *)(in_RDI + 0xc0) + 0xa28 + (long)iVar2) & 1) == 1) {
            *(undefined1 *)(*(long *)(in_RDI + 0xc0) + 0xa28 + (long)iVar2) = 0;
            gn_remove(in_stack_ffffffffffffc9d0,(int)((ulong)in_stack_ffffffffffffc9c8 >> 0x20));
            send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
          }
          else {
            *(undefined1 *)(*(long *)(in_RDI + 0xc0) + 0xa28 + (long)iVar2) = 1;
            for (local_2428 = 0; local_2428 < 0x13; local_2428 = local_2428 + 1) {
              bVar1 = str_cmp(local_2418,sphere_table[local_2428].name);
              if (!bVar1) {
                sprintf(&stack0xffffffffffffc9d8,"%s now has the elemental sphere %s.\n\r",
                        pCVar3->name,sphere_table[local_2428].name);
                send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
                _Var5 = std::pow<int,int>(0,0x597c19);
                in_stack_ffffffffffffc9c8 = (CHAR_DATA *)(long)_Var5;
                in_stack_ffffffffffffc9d0 = *(CHAR_DATA **)(in_RDI + 0xc0);
                lVar4 = (long)((int)sphere_table[local_2428].element / 0x20);
                in_stack_ffffffffffffc9d0[3].progtypes[lVar4 + 5] =
                     (ulong)in_stack_ffffffffffffc9c8 |
                     in_stack_ffffffffffffc9d0[3].progtypes[lVar4 + 5];
                break;
              }
            }
            gn_add(in_stack_ffffffffffffc9d0,(int)((ulong)in_stack_ffffffffffffc9c8 >> 0x20));
            send_to_char(in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_sgset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	int gn, i;
	char mesg[MSL];

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax:\n\r  set sgroup <name> <group name>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Not on NPC's.\n\r", ch);
		return;
	}

	gn = group_lookup(arg2);

	if (gn != -1)
	{
		if (ch->pcdata->group_known[gn] == true)
		{
			ch->pcdata->group_known[gn] = false;
			gn_remove(victim, gn);
			send_to_char("Group removed.\n\r", ch);
		}
		else
		{
			ch->pcdata->group_known[gn] = true;

			/* Check for sorc focus and adjust accordingly */
			for (i = 0; i < (MAX_ELE); i++)
			{
				if (!str_cmp(arg2, sphere_table[i].name))
				{
					sprintf(mesg, "%s now has the elemental sphere %s.\n\r", victim->name, sphere_table[i].name);
					send_to_char(mesg, ch);

					SET_BIT(ch->pcdata->ele_sphere, sphere_table[i].element);
					break;
				}
			}

			gn_add(victim, gn);
			send_to_char("Group added.\n\r", ch);
		}
	}
}